

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_short>::hard_decision<bool>
          (RateAdaptiveCode<unsigned_short> *this,vector<bool,_std::allocator<bool>_> *out,
          vector<double,_std::allocator<double>_> *llrs,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *msg_c)

{
  double dVar1;
  double dVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  iterator iVar5;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference local_a0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_90;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  double local_80;
  double curr_sum;
  size_t j;
  _Bit_type *local_68;
  uint local_60;
  _Bit_type *local_58;
  uint local_50;
  _Bit_type *local_48;
  uint local_40;
  _Bit_type *local_38;
  uint local_30;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_28;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *msg_c_local;
  vector<double,_std::allocator<double>_> *llrs_local;
  vector<bool,_std::allocator<bool>_> *out_local;
  RateAdaptiveCode<unsigned_short> *this_local;
  
  local_28 = msg_c;
  msg_c_local = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)llrs;
  llrs_local = (vector<double,_std::allocator<double>_> *)out;
  out_local = (vector<bool,_std::allocator<bool>_> *)this;
  iVar5 = std::vector<bool,_std::allocator<bool>_>::begin(out);
  local_48 = iVar5.super__Bit_iterator_base._M_p;
  local_40 = iVar5.super__Bit_iterator_base._M_offset;
  local_38 = local_48;
  local_30 = local_40;
  iVar5 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)llrs_local);
  local_68 = iVar5.super__Bit_iterator_base._M_p;
  local_60 = iVar5.super__Bit_iterator_base._M_offset;
  j._4_4_ = 0;
  __first.super__Bit_iterator_base._M_offset = local_30;
  __first.super__Bit_iterator_base._M_p = local_38;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar5.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar5.super__Bit_iterator_base._0_12_,8);
  local_58 = local_68;
  local_50 = local_60;
  std::fill<std::_Bit_iterator,int>(__first,__last,(int *)((long)&j + 4));
  curr_sum = 0.0;
  while( true ) {
    dVar1 = curr_sum;
    dVar2 = (double)std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)msg_c_local);
    if ((ulong)dVar2 <= (ulong)dVar1) break;
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](local_28,(size_type)curr_sum);
    local_88._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar3);
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](local_28,(size_type)curr_sum);
    local_90._M_current = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar3);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)msg_c_local,(size_type)curr_sum);
    local_80 = std::
               accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                         (local_88,local_90,*pvVar4);
    if (local_80 < 0.0) {
      local_a0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)llrs_local,(size_type)curr_sum);
      std::_Bit_reference::operator=(&local_a0,true);
    }
    curr_sum = (double)((long)curr_sum + 1);
  }
  return;
}

Assistant:

void hard_decision(
                std::vector<Bit> &out,
                const std::vector<double> &llrs,
                const std::vector<std::vector<double>> &msg_c) const {
            std::fill(out.begin(), out.end(), 0);
            for (std::size_t j{}; j < llrs.size(); ++j) {
                const double curr_sum = std::accumulate(msg_c[j].begin(), msg_c[j].end(), llrs[j]);
                if (curr_sum < 0) {
                    out[j] = 1;
                }
            }
        }